

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

uint __thiscall Inline::CountActuals(Inline *this,Instr *callInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  StackSym *this_00;
  uint uVar5;
  Opnd *this_01;
  
  this_01 = callInstr->m_src2;
  bVar2 = IR::Opnd::IsSymOpnd(this_01);
  uVar5 = 0;
  if (bVar2) {
    uVar5 = 0;
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    do {
      bVar2 = IR::Opnd::IsSymOpnd(this_01);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1214,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar2) goto LAB_0050c972;
        *puVar3 = 0;
      }
      pSVar4 = IR::Opnd::AsSymOpnd(this_01);
      this_00 = Sym::AsStackSym(pSVar4->m_sym);
      if ((this_00->field_0x18 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1216,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar2) goto LAB_0050c972;
        *puVar3 = 0;
      }
      bVar2 = StackSym::IsArgSlotSym(this_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1217,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar2) {
LAB_0050c972:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      uVar5 = uVar5 + 1;
      this_01 = ((this_00->field_5).m_instrDef)->m_src2;
      bVar2 = IR::Opnd::IsSymOpnd(this_01);
    } while (bVar2);
  }
  return uVar5;
}

Assistant:

uint Inline::CountActuals(IR::Instr *callInstr)
{
    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    uint actualCount = 0;
    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            argInstr = sym->m_instrDef;
            ++actualCount;
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
    }
    return actualCount;
}